

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void __thiscall nuraft::buffer::put(buffer *this,string *str)

{
  short sVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  overflow_error *this_00;
  byte *pbVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong in_RSI;
  buffer *in_RDI;
  size_t i;
  byte *d;
  ulong local_30;
  
  sVar3 = size(in_RDI);
  sVar4 = pos(in_RDI);
  lVar5 = std::__cxx11::string::length();
  if (sVar3 - sVar4 < lVar5 + 1U) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer to store a string");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar6 = data(in_RDI);
  local_30 = 0;
  while( true ) {
    uVar7 = std::__cxx11::string::length();
    if (uVar7 <= local_30) break;
    pbVar8 = (byte *)std::__cxx11::string::operator[](in_RSI);
    pbVar6[local_30] = *pbVar8;
    local_30 = local_30 + 1;
  }
  lVar5 = std::__cxx11::string::length();
  pbVar6[lVar5] = '\0';
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    sVar1 = std::__cxx11::string::length();
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + sVar1 + 1;
  }
  else {
    iVar2 = std::__cxx11::string::length();
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + iVar2 + 1;
  }
  return;
}

Assistant:

void buffer::put(const std::string& str) {
    if (size() - pos() < (str.length() + 1)) {
        throw std::overflow_error("insufficient buffer to store a string");
    }

    byte* d = data();
    for (size_t i = 0; i < str.length(); ++i) {
        *(d + i) = (byte)str[i];
    }

    *(d + str.length()) = (byte)0;
    __mv_fw_block(this, str.length() + 1);
}